

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0455(SemanticModelTester *this)

{
  bool bVar1;
  TypeKind TVar2;
  BasicTypeKind BVar3;
  int iVar4;
  DeclarationListSyntax *pDVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  void *pvVar7;
  undefined8 uVar8;
  Lexeme *pLVar9;
  Type *pTVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  string local_138;
  string local_118;
  MemberDeclarationSymbol *local_f8;
  EnumeratorDeclarationSymbol *enumeratorSym1;
  EnumeratorDeclarationSyntax *enumeratorDecl1;
  string local_c8;
  MemberDeclarationSymbol *local_a8;
  EnumeratorDeclarationSymbol *enumeratorSym0;
  EnumeratorDeclarationSyntax *enumeratorDecl0;
  TagTypeSpecifierSyntax *tySpec;
  type *semaModel;
  type *tyDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"enum x { y , z = 1 } ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&tyDeclNode + 7));
  compile<psy::C::EnumDeclarationSyntax>((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tyDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::EnumDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::EnumDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  tySpec = (TagTypeSpecifierSyntax *)
           std::get<1ul,psy::C::EnumDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                     ((tuple<const_psy::C::EnumDeclarationSyntax_*,_const_psy::C::SemanticModel_*> *
                      )local_20);
  enumeratorDecl0 =
       (EnumeratorDeclarationSyntax *)
       TagDeclarationSyntax::typeSpecifier((TagDeclarationSyntax *)*semaModel);
  pDVar5 = TagTypeSpecifierSyntax::declarations((TagTypeSpecifierSyntax *)enumeratorDecl0);
  iVar4 = (*(((pDVar5->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x12])();
  enumeratorSym0 = (EnumeratorDeclarationSymbol *)CONCAT44(extraout_var,iVar4);
  local_a8 = &SemanticModel::enumeratorFor
                        ((SemanticModel *)
                         (tySpec->super_SpecifierSyntax).super_SyntaxNode.super_Managed.
                         _vptr_Managed,(EnumeratorDeclarationSyntax *)enumeratorSym0)->
              super_MemberDeclarationSymbol;
  if (local_a8 == (MemberDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x394);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pLVar9 = &MemberDeclarationSymbol::name(local_a8)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_c8,pLVar9);
  bVar1 = std::operator==(&local_c8,"y");
  std::__cxx11::string::~string((string *)&local_c8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pLVar9 = &MemberDeclarationSymbol::name(local_a8)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&enumeratorDecl1,pLVar9);
    poVar6 = std::operator<<(poVar6,(string *)&enumeratorDecl1);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = std::operator<<(poVar6,"y");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x395);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&enumeratorDecl1);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar10 = MemberDeclarationSymbol::type(local_a8);
  TVar2 = Type::kind(pTVar10);
  if (TVar2 != Basic) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pTVar10 = MemberDeclarationSymbol::type(local_a8);
    TVar2 = Type::kind(pTVar10);
    poVar6 = ::operator<<(poVar6,TVar2);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = ::operator<<(poVar6,Basic);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x396);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar10 = MemberDeclarationSymbol::type(local_a8);
  iVar4 = (*pTVar10->_vptr_Type[5])();
  BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar4));
  if (BVar3 != Int_S) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pTVar10 = MemberDeclarationSymbol::type(local_a8);
    iVar4 = (*pTVar10->_vptr_Type[5])();
    BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar4));
    poVar6 = C::operator<<(poVar6,BVar3);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = C::operator<<(poVar6,Int_S);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x397);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pDVar5 = TagTypeSpecifierSyntax::declarations((TagTypeSpecifierSyntax *)enumeratorDecl0);
  iVar4 = (*(((((pDVar5->
                super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                ).
                super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
               .next)->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x12])();
  enumeratorSym1 = (EnumeratorDeclarationSymbol *)CONCAT44(extraout_var_02,iVar4);
  local_f8 = &SemanticModel::enumeratorFor
                        ((SemanticModel *)
                         (tySpec->super_SpecifierSyntax).super_SyntaxNode.super_Managed.
                         _vptr_Managed,(EnumeratorDeclarationSyntax *)enumeratorSym1)->
              super_MemberDeclarationSymbol;
  if (local_f8 == (MemberDeclarationSymbol *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpression is NOT ");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x39c);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pLVar9 = &MemberDeclarationSymbol::name(local_f8)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_118,pLVar9);
  bVar1 = std::operator==(&local_118,"z");
  std::__cxx11::string::~string((string *)&local_118);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pLVar9 = &MemberDeclarationSymbol::name(local_f8)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_138,pLVar9);
    poVar6 = std::operator<<(poVar6,(string *)&local_138);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = std::operator<<(poVar6,"z");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x39d);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_138);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar10 = MemberDeclarationSymbol::type(local_f8);
  TVar2 = Type::kind(pTVar10);
  if (TVar2 != Basic) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pTVar10 = MemberDeclarationSymbol::type(local_f8);
    TVar2 = Type::kind(pTVar10);
    poVar6 = ::operator<<(poVar6,TVar2);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = ::operator<<(poVar6,Basic);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x39e);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  pTVar10 = MemberDeclarationSymbol::type(local_f8);
  iVar4 = (*pTVar10->_vptr_Type[5])();
  BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_03,iVar4));
  if (BVar3 != Int_S) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar6 = std::operator<<(poVar6,"\t\tActual  : ");
    pTVar10 = MemberDeclarationSymbol::type(local_f8);
    iVar4 = (*pTVar10->_vptr_Type[5])();
    BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_04,iVar4));
    poVar6 = C::operator<<(poVar6,BVar3);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\tExpected: ");
    poVar6 = C::operator<<(poVar6,Int_S);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"\t\t");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,0x39f);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&TestFailed::typeinfo,0);
  }
  return;
}

Assistant:

void SemanticModelTester::case0455()
{
    auto [tyDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y , z = 1 } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto enumeratorDecl0 = tySpec->declarations()->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym0 = semaModel->enumeratorFor(enumeratorDecl0);
    PSY_EXPECT_TRUE(enumeratorSym0);
    PSY_EXPECT_EQ_STR(enumeratorSym0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto enumeratorDecl1 = tySpec->declarations()->next->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym1 = semaModel->enumeratorFor(enumeratorDecl1);
    PSY_EXPECT_TRUE(enumeratorSym1);
    PSY_EXPECT_EQ_STR(enumeratorSym1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}